

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt)

{
  xmlRegAtomType xVar1;
  xmlRegAtomType xVar2;
  int iVar3;
  xmlRegStatePtr pxVar4;
  xmlRegTrans *pxVar5;
  xmlRegAtomPtr pxVar6;
  xmlRegAtomPtr pxVar7;
  xmlChar *str;
  xmlChar *str_00;
  xmlRegRangePtr pxVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  xmlRegAtomType xVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  xmlChar *pxVar16;
  xmlChar *pxVar17;
  xmlRegAtomType xVar18;
  long lVar19;
  xmlRegTrans *pxVar20;
  long lVar21;
  xmlRegRangePtr pxVar22;
  xmlRegRangePtr pxVar23;
  xmlRegTrans *pxVar24;
  long lVar25;
  xmlRegAtomPtr pxVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  uint local_7c;
  
  if (ctxt->determinist != -1) {
    return ctxt->determinist;
  }
  if (0 < ctxt->nbStates) {
    uVar14 = ctxt->flags;
    lVar21 = 0;
    do {
      pxVar4 = ctxt->states[lVar21];
      if (((pxVar4 != (xmlRegStatePtr)0x0) && (1 < pxVar4->nbTrans)) && (0 < pxVar4->nbTrans)) {
        lVar25 = 0;
        lVar27 = 0;
        do {
          if ((pxVar4->trans[lVar27].atom != (xmlRegAtomPtr)0x0) &&
             (pxVar24 = pxVar4->trans + lVar27, lVar27 != 0 && pxVar24->to != -1)) {
            lVar19 = 0;
            do {
              pxVar5 = pxVar4->trans;
              iVar13 = *(int *)((long)&pxVar5->to + lVar19);
              if (((iVar13 != -1) &&
                  (pxVar6 = *(xmlRegAtomPtr *)((long)&pxVar5->atom + lVar19),
                  pxVar6 != (xmlRegAtomPtr)0x0)) && (pxVar24->to == iVar13)) {
                pxVar7 = pxVar24->atom;
                if (pxVar7 == pxVar6) {
                  uVar11 = 1;
                }
                else {
                  uVar11 = 0;
                  if ((pxVar7 != (xmlRegAtomPtr)0x0) &&
                     (xVar1 = pxVar7->type, uVar11 = 0, xVar1 == pxVar6->type)) {
                    if (xVar1 == XML_REGEXP_CHARVAL) {
                      bVar29 = pxVar7->codepoint == pxVar6->codepoint;
LAB_001a98fb:
                      uVar11 = (uint)bVar29;
                    }
                    else if (xVar1 == XML_REGEXP_STRING) {
                      if ((uVar14 & 1) != 0) {
                        bVar29 = pxVar7->valuep == pxVar6->valuep;
                        goto LAB_001a98fb;
                      }
                      uVar11 = xmlStrEqual((xmlChar *)pxVar7->valuep,(xmlChar *)pxVar6->valuep);
                    }
                  }
                }
                if (((uVar11 != 0) &&
                    (pxVar24->counter == *(int *)((long)&pxVar5->counter + lVar19))) &&
                   (pxVar24->count == *(int *)((long)&pxVar5->count + lVar19))) {
                  *(undefined4 *)((long)&pxVar5->to + lVar19) = 0xffffffff;
                }
              }
              lVar19 = lVar19 + 0x18;
            } while (lVar25 != lVar19);
          }
          lVar27 = lVar27 + 1;
          lVar25 = lVar25 + 0x18;
        } while (lVar27 < pxVar4->nbTrans);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < ctxt->nbStates);
  }
  if (ctxt->nbStates < 1) {
    iVar13 = 1;
  }
  else {
    lVar21 = 0;
    iVar13 = 1;
    do {
      pxVar4 = ctxt->states[lVar21];
      if ((pxVar4 != (xmlRegStatePtr)0x0) && (1 < pxVar4->nbTrans)) {
        if (pxVar4->nbTrans < 1) {
          pxVar24 = (xmlRegTrans *)0x0;
        }
        else {
          lVar25 = 0;
          pxVar24 = (xmlRegTrans *)0x0;
          do {
            if ((pxVar4->trans[lVar25].atom != (xmlRegAtomPtr)0x0) &&
               (pxVar5 = pxVar4->trans + lVar25, lVar25 != 0 && pxVar5->to != -1)) {
              lVar27 = 0;
              do {
                if (pxVar4->trans[lVar27].to == -1) goto LAB_001a9f13;
                pxVar20 = pxVar4->trans + lVar27;
                pxVar6 = pxVar20->atom;
                if (pxVar6 == (xmlRegAtomPtr)0x0) {
                  iVar3 = pxVar5->to;
                  if ((long)iVar3 != -1) {
                    iVar13 = xmlFARecurseDeterminism
                                       (ctxt,*(xmlRegStatePtr *)
                                              (&((xmlRegAtomPtr)ctxt->states)->no + (long)iVar3 * 2)
                                        ,iVar3,(xmlRegAtomPtr)ctxt->states);
                    xmlFAFinishRecurseDeterminism(ctxt,ctxt->states[pxVar5->to]);
                    pxVar20 = pxVar5;
                    if (iVar13 == 0) goto LAB_001a9f07;
                  }
                }
                else {
                  pxVar7 = pxVar5->atom;
                  if (pxVar7 != pxVar6) {
                    if (pxVar7 == (xmlRegAtomPtr)0x0) goto LAB_001a9f13;
                    if ((pxVar7->type == XML_REGEXP_ANYCHAR) || (pxVar6->type == XML_REGEXP_ANYCHAR)
                       ) goto LAB_001a9eff;
                    pxVar26 = pxVar7;
                    if (pxVar6->type < pxVar7->type) {
                      pxVar26 = pxVar6;
                      pxVar6 = pxVar7;
                    }
                    xVar1 = pxVar26->type;
                    xVar2 = pxVar6->type;
                    local_7c = 1;
                    if (xVar1 != xVar2) {
                      bVar29 = true;
                      if ((5 < xVar1 - XML_REGEXP_EPSILON) && (5 < xVar2 - XML_REGEXP_EPSILON)) {
                        xVar12 = xVar2;
                        if (xVar1 >= xVar2 && xVar1 != xVar2) {
                          xVar12 = xVar1;
                        }
                        xVar18 = xVar2;
                        if (xVar1 < xVar2) {
                          xVar18 = xVar1;
                        }
                        switch(xVar18) {
                        case XML_REGEXP_LETTER:
                          bVar29 = xVar12 < XML_REGEXP_MARK;
                          break;
                        case XML_REGEXP_LETTER_UPPERCASE:
                        case XML_REGEXP_LETTER_LOWERCASE:
                        case XML_REGEXP_LETTER_TITLECASE:
                        case XML_REGEXP_LETTER_MODIFIER:
                        case XML_REGEXP_LETTER_OTHERS:
                        case XML_REGEXP_MARK_NONSPACING:
                        case XML_REGEXP_MARK_SPACECOMBINING:
                        case XML_REGEXP_MARK_ENCLOSING:
                        case XML_REGEXP_NUMBER_DECIMAL:
                        case XML_REGEXP_NUMBER_LETTER:
                        case XML_REGEXP_NUMBER_OTHERS:
                        case XML_REGEXP_PUNCT_CONNECTOR:
                        case XML_REGEXP_PUNCT_DASH:
                        case XML_REGEXP_PUNCT_OPEN:
                        case XML_REGEXP_PUNCT_CLOSE:
                        case XML_REGEXP_PUNCT_INITQUOTE:
                        case XML_REGEXP_PUNCT_FINQUOTE:
                        case XML_REGEXP_PUNCT_OTHERS:
                        case XML_REGEXP_SEPAR_SPACE:
                        case XML_REGEXP_SEPAR_LINE:
                        case XML_REGEXP_SEPAR_PARA:
                        case XML_REGEXP_SYMBOL_MATH:
                        case XML_REGEXP_SYMBOL_CURRENCY:
                        case XML_REGEXP_SYMBOL_MODIFIER:
                        case XML_REGEXP_SYMBOL_OTHERS:
                        case XML_REGEXP_OTHER_CONTROL:
                        case XML_REGEXP_OTHER_FORMAT:
                        case XML_REGEXP_OTHER_PRIVATE:
                        case XML_REGEXP_OTHER_NA:
                          bVar29 = false;
                          break;
                        case XML_REGEXP_MARK:
                          bVar29 = xVar12 < XML_REGEXP_NUMBER;
                          break;
                        case XML_REGEXP_NUMBER:
                          bVar29 = xVar12 < XML_REGEXP_PUNCT;
                          break;
                        case XML_REGEXP_PUNCT:
                          bVar29 = xVar12 < XML_REGEXP_SEPAR;
                          break;
                        case XML_REGEXP_SEPAR:
                          bVar29 = xVar12 < XML_REGEXP_SYMBOL;
                          break;
                        case XML_REGEXP_SYMBOL:
                          bVar29 = xVar12 < XML_REGEXP_OTHER;
                          break;
                        case XML_REGEXP_OTHER:
                          bVar29 = xVar12 < XML_REGEXP_BLOCK_NAME;
                          break;
                        default:
                          switch(xVar18) {
                          case XML_REGEXP_ANYSPACE:
                            bVar29 = false;
                            if ((0x15 < xVar12 - XML_REGEXP_LETTER) &&
                               (4 < xVar12 - XML_REGEXP_SYMBOL)) {
                              bVar30 = xVar12 == XML_REGEXP_NOTSPACE;
LAB_001a9fb9:
                              bVar29 = false;
                              if (!bVar30) goto switchD_001a9f49_caseD_8;
                            }
                            break;
                          default:
switchD_001a9f49_caseD_8:
                            bVar29 = true;
                            break;
                          case XML_REGEXP_INITNAME:
                            bVar29 = false;
                            if (0x1d < xVar12 - XML_REGEXP_MARK) {
                              bVar30 = xVar12 == XML_REGEXP_NOTINITNAME;
                              goto LAB_001a9fb9;
                            }
                            break;
                          case XML_REGEXP_NAMECHAR:
                            bVar29 = false;
                            if ((0x15 < xVar12 - XML_REGEXP_PUNCT) && (3 < xVar12 - XML_REGEXP_MARK)
                               ) {
                              bVar30 = xVar12 == XML_REGEXP_NOTNAMECHAR;
                              goto LAB_001a9fb9;
                            }
                            break;
                          case XML_REGEXP_DECIMAL:
                            bVar29 = false;
                            if (((0x23 < xVar12 - XML_REGEXP_LETTER) ||
                                ((0xfffffc3ffU >> ((ulong)(xVar12 - XML_REGEXP_LETTER) & 0x3f) & 1)
                                 == 0)) && (bVar29 = false, 1 < xVar12 - XML_REGEXP_NOTDECIMAL))
                            goto switchD_001a9f49_caseD_8;
                            break;
                          case XML_REGEXP_REALCHAR:
                            bVar29 = false;
                            if ((0x15 < xVar12 - XML_REGEXP_PUNCT) &&
                               (bVar29 = false, 3 < xVar12 - XML_REGEXP_MARK)) {
                              bVar30 = xVar12 == XML_REGEXP_NOTDECIMAL;
                              goto LAB_001a9fb9;
                            }
                          }
                        }
                      }
                      if (bVar29 == false) goto LAB_001a9f13;
                      local_7c = (uint)bVar29;
                    }
                    if (xVar1 == XML_REGEXP_CHARVAL) {
                      if (xVar2 == XML_REGEXP_CHARVAL) {
                        local_7c = (uint)(pxVar26->codepoint == pxVar6->codepoint);
                      }
                      else {
                        local_7c = xmlRegCheckCharacter(pxVar6,pxVar26->codepoint);
                        if ((int)local_7c < 0) {
                          local_7c = 1;
                        }
                      }
                    }
                    else if (xVar1 == XML_REGEXP_RANGES) {
                      if (xVar2 == XML_REGEXP_RANGES) {
                        if (0 < pxVar26->nbRanges) {
                          lVar19 = 0;
                          do {
                            if (0 < pxVar6->nbRanges) {
                              lVar28 = 0;
                              do {
                                pxVar8 = pxVar26->ranges[lVar19];
                                xVar1 = pxVar8->type;
                                if ((xVar1 != XML_REGEXP_RANGES) &&
                                   ((xVar1 & ~XML_REGEXP_EPSILON) != XML_REGEXP_SUBREG)) {
                                  pxVar23 = pxVar6->ranges[lVar28];
                                  if (2 < pxVar23->type - XML_REGEXP_RANGES) {
                                    pxVar22 = pxVar23;
                                    if (pxVar23->type < xVar1) {
                                      pxVar22 = pxVar8;
                                      pxVar8 = pxVar23;
                                    }
                                    xVar1 = pxVar8->type;
                                    bVar29 = true;
                                    if ((xVar1 == XML_REGEXP_ANYCHAR) ||
                                       (xVar2 = pxVar22->type, xVar2 == XML_REGEXP_ANYCHAR))
                                    goto LAB_001a9c1f;
                                    if ((xVar1 == XML_REGEXP_EPSILON) ||
                                       (xVar2 == XML_REGEXP_EPSILON)) goto LAB_001a9c36;
                                    if (xVar1 == xVar2) {
                                      if (xVar1 == XML_REGEXP_CHARVAL) {
                                        if (pxVar8->end < pxVar22->start) {
LAB_001a9c7c:
                                          bVar29 = false;
                                        }
                                        else {
                                          bVar29 = pxVar8->start <= pxVar22->end;
                                        }
                                      }
                                    }
                                    else {
                                      local_7c = 1;
                                      if (xVar1 == XML_REGEXP_CHARVAL) {
                                        if (pxVar8->neg == 0) {
                                          if (pxVar22->neg != 0) goto LAB_001a9d4a;
LAB_001a9cf0:
                                          bVar9 = 1;
                                          bVar10 = 0;
                                        }
                                        else {
                                          if (pxVar22->neg != 0) goto LAB_001a9cf0;
LAB_001a9d4a:
                                          bVar10 = 1;
                                          bVar9 = 0;
                                        }
                                        pxVar23 = pxVar22;
                                        iVar3 = pxVar8->start;
                                        if (pxVar8->start <= pxVar8->end) {
                                          do {
                                            iVar15 = xmlRegCheckCharacterRange
                                                               (pxVar22->type,iVar3,pxVar22->start,
                                                                pxVar22->end,(int)pxVar22->blockName
                                                                ,(xmlChar *)pxVar23);
                                            if (iVar15 < 0) break;
                                            if (((bool)(bVar10 & iVar15 == 0)) ||
                                               ((bool)(iVar15 == 1 & bVar9))) goto LAB_001a9edb;
                                            bVar29 = iVar3 < pxVar8->end;
                                            iVar3 = iVar3 + 1;
                                          } while (bVar29);
                                        }
                                        goto LAB_001a9c36;
                                      }
                                      if ((xVar1 == XML_REGEXP_BLOCK_NAME) ||
                                         (xVar2 == XML_REGEXP_BLOCK_NAME)) goto LAB_001a9edb;
                                      if ((xVar1 < XML_REGEXP_LETTER) || (xVar2 < XML_REGEXP_LETTER)
                                         ) {
                                        if ((((xVar1 != XML_REGEXP_ANYSPACE) ||
                                             (xVar2 != XML_REGEXP_NOTSPACE)) &&
                                            ((xVar1 != XML_REGEXP_INITNAME ||
                                             (xVar2 != XML_REGEXP_NOTINITNAME)))) &&
                                           (((xVar1 != XML_REGEXP_NAMECHAR ||
                                             (xVar2 != XML_REGEXP_NOTNAMECHAR)) &&
                                            ((xVar1 != XML_REGEXP_DECIMAL ||
                                             (xVar2 != XML_REGEXP_NOTDECIMAL)))))) {
                                          if ((xVar1 == XML_REGEXP_REALCHAR) &&
                                             (xVar2 == XML_REGEXP_NOTREALCHAR)) goto LAB_001a9c7c;
                                          goto LAB_001a9edb;
                                        }
                                        bVar29 = false;
                                      }
                                      else if ((int)xVar1 < 0x72) {
                                        if (xVar1 != XML_REGEXP_LETTER) {
                                          if (xVar1 == XML_REGEXP_MARK) {
                                            uVar14 = xVar2 - XML_REGEXP_MARK_NONSPACING;
                                          }
                                          else {
                                            if (xVar1 != XML_REGEXP_NUMBER) goto LAB_001a9e1b;
                                            uVar14 = xVar2 - XML_REGEXP_NUMBER_DECIMAL;
                                          }
                                          goto LAB_001a9e43;
                                        }
                                        bVar29 = xVar2 - XML_REGEXP_LETTER_UPPERCASE < 5;
                                      }
                                      else if ((int)xVar1 < 0x7e) {
                                        if (xVar1 == XML_REGEXP_PUNCT) {
                                          bVar29 = xVar2 - XML_REGEXP_PUNCT_CONNECTOR < 7;
                                        }
                                        else {
                                          if (xVar1 != XML_REGEXP_SEPAR) {
LAB_001a9e1b:
                                            if (xVar2 < XML_REGEXP_BLOCK_NAME) goto LAB_001a9c7c;
                                            goto LAB_001a9edb;
                                          }
                                          uVar14 = xVar2 - XML_REGEXP_SEPAR_SPACE;
LAB_001a9e43:
                                          bVar29 = uVar14 < 3;
                                        }
                                      }
                                      else {
                                        if (xVar1 != XML_REGEXP_SYMBOL) {
                                          if (xVar1 != XML_REGEXP_OTHER) goto LAB_001a9e1b;
                                          uVar14 = xVar2 - XML_REGEXP_OTHER_CONTROL;
                                          goto LAB_001a9e43;
                                        }
                                        bVar29 = xVar2 - XML_REGEXP_SYMBOL_MATH < 4;
                                      }
                                    }
LAB_001a9c1f:
                                    if (pxVar8->neg == 0) {
                                      if (pxVar22->neg != 0) goto LAB_001a9c2b;
                                    }
                                    else if (pxVar22->neg == 0) {
LAB_001a9c2b:
                                      bVar29 = (bool)(bVar29 ^ 1);
                                    }
                                    if (bVar29) {
                                      local_7c = 1;
                                      goto LAB_001a9edb;
                                    }
                                  }
                                }
LAB_001a9c36:
                                lVar28 = lVar28 + 1;
                              } while (lVar28 < pxVar6->nbRanges);
                            }
                            lVar19 = lVar19 + 1;
                          } while (lVar19 < pxVar26->nbRanges);
                        }
                        local_7c = 0;
                      }
                    }
                    else {
                      if (xVar1 != XML_REGEXP_STRING) goto LAB_001a9eff;
                      str = (xmlChar *)pxVar26->valuep;
                      str_00 = (xmlChar *)pxVar6->valuep;
                      pxVar16 = xmlStrchr(str,'|');
                      pxVar17 = xmlStrchr(str_00,'|');
                      if ((pxVar16 != (xmlChar *)0x0) == (pxVar17 == (xmlChar *)0x0))
                      goto LAB_001a9f13;
                      local_7c = xmlRegStrEqualWildcard(str,str_00);
                    }
LAB_001a9edb:
                    uVar14 = (uint)(local_7c == 0);
                    if (pxVar26->neg == pxVar6->neg) {
                      uVar14 = local_7c;
                    }
                    if (uVar14 == 0) goto LAB_001a9f13;
                  }
LAB_001a9eff:
                  pxVar5->nd = 1;
LAB_001a9f07:
                  pxVar20->nd = 1;
                  iVar13 = 0;
                  pxVar24 = pxVar5;
                }
LAB_001a9f13:
                lVar27 = lVar27 + 1;
              } while (lVar27 != lVar25);
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 < pxVar4->nbTrans);
        }
        if (pxVar24 != (xmlRegTrans *)0x0) {
          pxVar24->nd = 2;
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < ctxt->nbStates);
  }
  ctxt->determinist = iVar13;
  return iVar13;
}

Assistant:

static int
xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    xmlRegTransPtr t1, t2, last;
    int i;
    int ret = 1;
    int deep = 1;

#ifdef DEBUG_REGEXP_GRAPH
    printf("xmlFAComputesDeterminism\n");
    xmlRegPrintCtxt(stdout, ctxt);
#endif
    if (ctxt->determinist != -1)
	return(ctxt->determinist);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * First cleanup the automata removing cancelled transitions
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		/* t1->nd = 1; */
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
		    if (t1->to == t2->to) {
                        /*
                         * Here we use deep because we want to keep the
                         * transitions which indicate a conflict
                         */
			if (xmlFAEqualAtoms(t1->atom, t2->atom, deep) &&
                            (t1->counter == t2->counter) &&
                            (t1->count == t2->count))
			    t2->to = -1; /* eliminated */
		    }
		}
	    }
	}
    }

    /*
     * Check for all states that there aren't 2 transitions
     * with the same atom and a different target.
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	last = NULL;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
                    /*
                     * But here we don't use deep because we want to
                     * find transitions which indicate a conflict
                     */
		    if (xmlFACompareAtoms(t1->atom, t2->atom, 1)) {
			ret = 0;
			/* mark the transitions as non-deterministic ones */
			t1->nd = 1;
			t2->nd = 1;
			last = t1;
		    }
		} else if (t1->to != -1) {
		    /*
		     * do the closure in case of remaining specific
		     * epsilon transitions like choices or all
		     */
		    ret = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
						   t2->to, t2->atom);
                    xmlFAFinishRecurseDeterminism(ctxt, ctxt->states[t1->to]);
		    /* don't shortcut the computation so all non deterministic
		       transition get marked down
		    if (ret == 0)
			return(0);
		     */
		    if (ret == 0) {
			t1->nd = 1;
			/* t2->nd = 1; */
			last = t1;
		    }
		}
	    }
	    /* don't shortcut the computation so all non deterministic
	       transition get marked down
	    if (ret == 0)
		break; */
	}

	/*
	 * mark specifically the last non-deterministic transition
	 * from a state since there is no need to set-up rollback
	 * from it
	 */
	if (last != NULL) {
	    last->nd = 2;
	}

	/* don't shortcut the computation so all non deterministic
	   transition get marked down
	if (ret == 0)
	    break; */
    }

    ctxt->determinist = ret;
    return(ret);
}